

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_explain.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *progname;
  int iVar1;
  uint uVar2;
  uint flags;
  
  progname = *argv;
  flags = 0;
  do {
    iVar1 = getopt(argc,argv,"pahv");
    if (iVar1 < 0x68) {
      if (iVar1 != 0x61) {
        if (iVar1 == -1) {
          if (argc - _optind == 1) {
            version_explain(argv[_optind],flags);
            return 0;
          }
          goto LAB_0010136c;
        }
        if (iVar1 != 0x3f) goto LAB_0010136c;
        goto LAB_00101340;
      }
      uVar2 = 2;
    }
    else {
      uVar2 = 1;
      if (iVar1 != 0x70) {
        if (iVar1 == 0x68) {
LAB_00101340:
          print_usage(progname);
        }
        else {
          if (iVar1 != 0x76) {
LAB_0010136c:
            print_usage(progname);
            return 1;
          }
          main_cold_1();
        }
        return 0;
      }
    }
    flags = flags | uVar2;
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
	int ch, flags = 0;
	const char* progname = argv[0];

	while ((ch = getopt(argc, argv, "pahv")) != -1) {
		switch (ch) {
		case 'p':
			flags |= VERSIONFLAG_P_IS_PATCH;
			break;
		case 'a':
			flags |= VERSIONFLAG_ANY_IS_PATCH;
			break;
		case 'h':
		case '?':
			print_usage(progname);
			return 0;
		case 'v':
			print_version();
			return 0;
		default:
			print_usage(progname);
			return 1;
		}
	}

	argc -= optind;
	argv += optind;

	if (argc == 1) {
		version_explain(argv[0], flags);
		return 0;
	}

	print_usage(progname);
    return 1;
}